

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O3

void __thiscall
AddressFactory_Constructor_type_prefix_Test::TestBody
          (AddressFactory_Constructor_type_prefix_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AddressFactory factory_3;
  Pubkey pubkey;
  AddressFactory factory;
  Message local_4e8;
  AssertHelper local_4e0;
  AssertHelper local_4d8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  AddressFactory local_4c8;
  Pubkey local_4a0;
  undefined1 local_488 [32];
  uchar local_468 [16];
  void *local_458;
  void *local_440;
  void *local_428;
  code *local_410 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_398;
  Script local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  Pubkey local_310;
  uchar local_2f0 [16];
  void *local_2e0;
  void *local_2c8;
  void *local_2b0;
  code *local_298 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_220;
  Script local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  Pubkey local_198;
  uchar local_178 [16];
  void *local_168;
  void *local_150;
  void *local_138;
  code *local_120 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a8;
  Script local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_488,kMainnet,(vector *)&local_4c8)
      ;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&local_4c8);
      local_488._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_488 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa7,
               "Expected: AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4c8,(Message *)local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_488._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_488,kTestnet,(vector *)&local_4c8)
      ;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&local_4c8);
      local_488._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_488 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa8,
               "Expected: AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4c8,(Message *)local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_488._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::GetBitcoinAddressFormatList();
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_488,kRegtest,(vector *)&local_4c8)
      ;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )&local_4c8);
      local_488._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_488 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_4c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xa9,
               "Expected: AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_4c8,(Message *)local_488);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4c8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_488._0_8_ + 8))();
      }
    }
  }
  local_488._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_488 + 0x10)
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af","");
  cfd::core::Pubkey::Pubkey(&local_4a0,(string *)local_488);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_488 + 0x10))
  {
    operator_delete((void *)local_488._0_8_);
  }
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_4c8,kMainnet,(vector *)local_488);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_488);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)local_488);
  local_4e8.ss_.ptr_._0_4_ = local_488._0_4_;
  local_4e0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_4d8,"address.GetNetType()","NetType::kMainnet",(NetType *)&local_4e8
             ,(NetType *)&local_4e0);
  if (local_4d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_4e8);
    if (local_4d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_4d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xaf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    if (CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_4d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_4e8.ss_.ptr_._0_4_ = local_488._8_4_;
  local_4e0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_4d8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_4e8,(WitnessVersion *)&local_4e0);
  if (local_4d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_4e8);
    if (local_4d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_4d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    if (CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_4d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_340);
  cfd::core::Script::~Script(&local_380);
  local_410[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_398);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_410);
  if (local_428 != (void *)0x0) {
    operator_delete(local_428);
  }
  if (local_440 != (void *)0x0) {
    operator_delete(local_440);
  }
  if (local_458 != (void *)0x0) {
    operator_delete(local_458);
  }
  if ((uchar *)local_488._16_8_ != local_468) {
    operator_delete((void *)local_488._16_8_);
  }
  local_4c8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_4c8.prefix_list_);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_4c8,kTestnet,(vector *)local_488);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_488);
  cfd::AddressFactory::CreateP2wpkhAddress((Pubkey *)local_488);
  local_4e8.ss_.ptr_._0_4_ = local_488._0_4_;
  local_4e0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_4d8,"address.GetNetType()","NetType::kTestnet",(NetType *)&local_4e8
             ,(NetType *)&local_4e0);
  if (local_4d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_4e8);
    if (local_4d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_4d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    if (CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_4d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_4e8.ss_.ptr_._0_4_ = local_488._8_4_;
  local_4e0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_4d8,"address.GetWitnessVersion()","WitnessVersion::kVersion0",
             (WitnessVersion *)&local_4e8,(WitnessVersion *)&local_4e0);
  if (local_4d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_4e8);
    if (local_4d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_4d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    if (CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_4d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_340);
  cfd::core::Script::~Script(&local_380);
  local_410[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_398);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_410);
  if (local_428 != (void *)0x0) {
    operator_delete(local_428);
  }
  if (local_440 != (void *)0x0) {
    operator_delete(local_440);
  }
  if (local_458 != (void *)0x0) {
    operator_delete(local_458);
  }
  if ((uchar *)local_488._16_8_ != local_468) {
    operator_delete((void *)local_488._16_8_);
  }
  local_4c8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_4c8.prefix_list_);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory(&local_4c8,kRegtest,(vector *)local_488);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_488);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)local_488);
  local_4e8.ss_.ptr_._0_4_ = local_488._0_4_;
  local_4e0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_4d8,"address.GetNetType()","NetType::kRegtest",(NetType *)&local_4e8
             ,(NetType *)&local_4e0);
  if (local_4d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_4e8);
    if (local_4d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_4d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xbb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    if (CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_4d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_4e8.ss_.ptr_._0_4_ = local_488._8_4_;
  local_4e0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_4d8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_4e8,(WitnessVersion *)&local_4e0);
  if (local_4d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_4e8);
    if (local_4d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_4d0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0xbc,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    if (CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_4e8.ss_.ptr_._4_4_,(NetType)local_4e8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_4d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_340);
  cfd::core::Script::~Script(&local_380);
  local_410[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_398);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_410);
  if (local_428 != (void *)0x0) {
    operator_delete(local_428);
  }
  if (local_440 != (void *)0x0) {
    operator_delete(local_440);
  }
  if (local_458 != (void *)0x0) {
    operator_delete(local_458);
  }
  if ((uchar *)local_488._16_8_ != local_468) {
    operator_delete((void *)local_488._16_8_);
  }
  local_4c8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_4c8.prefix_list_);
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_488,kLiquidV1,(vector *)&local_4c8);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_4c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_198);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_50);
    cfd::core::Script::~Script(&local_90);
    local_120[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a8)
    ;
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_120);
    if (local_138 != (void *)0x0) {
      operator_delete(local_138);
    }
    if (local_150 != (void *)0x0) {
      operator_delete(local_150);
    }
    if (local_168 != (void *)0x0) {
      operator_delete(local_168);
    }
    if (local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != local_178) {
      operator_delete(local_198.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  testing::Message::Message((Message *)&local_4c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_4d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xc2,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4c8);
  testing::internal::AssertHelper::~AssertHelper(&local_4d8);
  if (local_4c8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_4c8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_4c8._vptr_AddressFactory + 8))();
    }
  }
  local_488._0_8_ = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (local_488 + 0x10));
  cfd::core::GetBitcoinAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)local_488,kElementsRegtest,(vector *)&local_4c8);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_4c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_310);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1c8);
    cfd::core::Script::~Script(&local_208);
    local_298[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_220);
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_298);
    if (local_2b0 != (void *)0x0) {
      operator_delete(local_2b0);
    }
    if (local_2c8 != (void *)0x0) {
      operator_delete(local_2c8);
    }
    if (local_2e0 != (void *)0x0) {
      operator_delete(local_2e0);
    }
    if (local_310.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != local_2f0) {
      operator_delete(local_310.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  testing::Message::Message((Message *)&local_4c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_4d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0xc6,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_4d8,(Message *)&local_4c8);
  testing::internal::AssertHelper::~AssertHelper(&local_4d8);
  if (local_4c8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_4c8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_4c8._vptr_AddressFactory + 8))();
    }
  }
  local_488._0_8_ = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (local_488 + 0x10));
  if (local_4a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4a0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type_prefix)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList()));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList()));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  {
    AddressFactory factory(NetType::kMainnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2wpkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersion0);
  }
  {
    AddressFactory factory(NetType::kRegtest, GetBitcoinAddressFormatList());
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }

  // error
  {
    AddressFactory factory(NetType::kLiquidV1, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest, GetBitcoinAddressFormatList());
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}